

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fttrigon.c
# Opt level: O0

FT_Int ft_trig_prenorm(FT_Vector *vec)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  byte bVar5;
  long local_40;
  long local_30;
  int local_24;
  FT_Int shift;
  FT_Pos y;
  FT_Pos x;
  FT_Vector *vec_local;
  
  lVar1 = vec->x;
  lVar2 = vec->y;
  local_30 = lVar1;
  if (lVar1 < 0) {
    local_30 = -lVar1;
  }
  local_40 = lVar2;
  if (lVar2 < 0) {
    local_40 = -lVar2;
  }
  uVar4 = (uint)local_30 | (uint)local_40;
  uVar3 = 0x1f;
  if (uVar4 != 0) {
    for (; uVar4 >> uVar3 == 0; uVar3 = uVar3 - 1) {
    }
  }
  local_24 = -(uVar3 ^ 0x1f) + 0x1f;
  if (local_24 < 0x1e) {
    local_24 = 0x1d - local_24;
    vec->x = lVar1 << ((byte)local_24 & 0x3f);
    vec->y = lVar2 << ((byte)local_24 & 0x3f);
  }
  else {
    local_24 = -(uVar3 ^ 0x1f) + 2;
    bVar5 = (byte)local_24;
    vec->x = lVar1 >> (bVar5 & 0x3f);
    vec->y = lVar2 >> (bVar5 & 0x3f);
    local_24 = -local_24;
  }
  return local_24;
}

Assistant:

static FT_Int
  ft_trig_prenorm( FT_Vector*  vec )
  {
    FT_Pos  x, y;
    FT_Int  shift;


    x = vec->x;
    y = vec->y;

    shift = FT_MSB( (FT_UInt32)( FT_ABS( x ) | FT_ABS( y ) ) );

    if ( shift <= FT_TRIG_SAFE_MSB )
    {
      shift  = FT_TRIG_SAFE_MSB - shift;
      vec->x = (FT_Pos)( (FT_ULong)x << shift );
      vec->y = (FT_Pos)( (FT_ULong)y << shift );
    }
    else
    {
      shift -= FT_TRIG_SAFE_MSB;
      vec->x = x >> shift;
      vec->y = y >> shift;
      shift  = -shift;
    }

    return shift;
  }